

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int32 get_quests(node *root,int32 **qarr,int32 *nph,int32 nquests,int32 depth)

{
  int32 *__base;
  int local_3c;
  int32 i;
  int32 *sortedidx;
  int32 depth_local;
  int32 nquests_local;
  int32 *nph_local;
  int32 **qarr_local;
  node *root_local;
  
  if ((1 < root->nphones) || (root_local._4_4_ = nquests, depth < 4)) {
    sortedidx._4_4_ = nquests;
    if (0 < depth) {
      __base = (int32 *)__ckd_calloc__((long)root->nphones,4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                       ,0x2ba);
      for (local_3c = 0; local_3c < root->nphones; local_3c = local_3c + 1) {
        __base[local_3c] = root->phoneids[local_3c];
      }
      qsort(__base,(long)root->nphones,4,compare);
      nph[nquests] = root->nphones;
      sortedidx._4_4_ = nquests + 1;
      qarr[nquests] = __base;
    }
    if (root->nphones < 2) {
      root_local._4_4_ = sortedidx._4_4_;
    }
    else {
      if (root->left != (node_str *)0x0) {
        sortedidx._4_4_ = get_quests(root->left,qarr,nph,sortedidx._4_4_,depth + 1);
      }
      if (root->right != (node_str *)0x0) {
        sortedidx._4_4_ = get_quests(root->right,qarr,nph,sortedidx._4_4_,depth + 1);
      }
      root_local._4_4_ = sortedidx._4_4_;
    }
  }
  return root_local._4_4_;
}

Assistant:

int32 get_quests(node *root,int32 **qarr,int32 *nph,int32 nquests,int32 depth)
{
    int32 *sortedidx,i;

    if (root->nphones < 2 && depth > 3) return nquests;

    if (depth > 0){
        sortedidx = (int32 *)ckd_calloc(root->nphones,sizeof(int32));
        for (i=0;i<root->nphones;i++) sortedidx[i] = root->phoneids[i];
        qsort(sortedidx,root->nphones,sizeof(int32),compare);
        nph[nquests] = root->nphones;
        qarr[nquests++] = sortedidx;
    }

    if (root->nphones < 2) return nquests;
    if (root->left != NULL) 
        nquests = get_quests(root->left,qarr,nph,nquests,depth+1);
    if (root->right != NULL) 
        nquests = get_quests(root->right,qarr,nph,nquests,depth+1);

    return nquests;
}